

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr162.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  IkSolutionBase<double> *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IkReal *pfree;
  pointer pdVar4;
  ulong index;
  size_t i;
  long lVar5;
  size_t j;
  ulong uVar6;
  double dVar7;
  allocator_type local_101;
  vector<double,_std::allocator<double>_> solvalues;
  IkSolutionList<double> solutions;
  vector<double,_std::allocator<double>_> vsolfree;
  vector<double,_std::allocator<double>_> vfree;
  IkReal eetrans [3];
  IkReal eerot [9];
  
  if (argc == 0xd) {
    solutions._listsolutions.
    super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&solutions._listsolutions;
    solutions.super_IkSolutionListBase<double>._vptr_IkSolutionListBase =
         (_func_int **)&PTR__IkSolutionList_0013cc18;
    solutions._listsolutions.
    super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
    _M_impl._M_node._M_size = 0;
    solutions._listsolutions.
    super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
    _M_impl._M_node.super__List_node_base._M_prev =
         solutions._listsolutions.
         super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
         _M_impl._M_node.super__List_node_base._M_next;
    std::vector<double,_std::allocator<double>_>::vector(&vfree,0,(allocator_type *)eerot);
    eerot[0] = atof(argv[1]);
    eerot[1] = atof(argv[2]);
    eerot[2] = atof(argv[3]);
    eetrans[0] = atof(argv[4]);
    eerot[3] = atof(argv[5]);
    eerot[4] = atof(argv[6]);
    eerot[5] = atof(argv[7]);
    eetrans[1] = atof(argv[8]);
    eerot[6] = atof(argv[9]);
    eerot[7] = atof(argv[10]);
    eerot[8] = atof(argv[0xb]);
    eetrans[2] = atof(argv[0xc]);
    for (lVar5 = 0;
        (long)vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != lVar5; lVar5 = lVar5 + 1) {
      dVar7 = atof(argv[lVar5 + 0xd]);
      vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = dVar7;
    }
    pfree = (IkReal *)0x0;
    if (vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      pfree = vfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    }
    bVar1 = ComputeIk(eetrans,eerot,pfree,&solutions.super_IkSolutionListBase<double>);
    if (bVar1) {
      printf("Found %d ik solutions:\n",
             solutions._listsolutions.
             super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
             ._M_impl._M_node._M_size & 0xffffffff);
      std::vector<double,_std::allocator<double>_>::vector(&solvalues,6,(allocator_type *)&vsolfree)
      ;
      for (index = 0;
          index < solutions._listsolutions.
                  super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
                  ._M_impl._M_node._M_size; index = index + 1) {
        pIVar3 = ikfast::IkSolutionList<double>::GetSolution(&solutions,index);
        iVar2 = (*pIVar3->_vptr_IkSolutionBase[4])(pIVar3);
        printf("sol%d (free=%d): ",index & 0xffffffff,
               (ulong)(((long *)CONCAT44(extraout_var,iVar2))[1] -
                      *(long *)CONCAT44(extraout_var,iVar2)) >> 2);
        iVar2 = (*pIVar3->_vptr_IkSolutionBase[4])(pIVar3);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   &vsolfree.super__Vector_base<double,_std::allocator<double>_>,
                   ((long *)CONCAT44(extraout_var_00,iVar2))[1] -
                   *(long *)CONCAT44(extraout_var_00,iVar2) >> 2,&local_101);
        pdVar4 = (pointer)0x0;
        if (vsolfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            vsolfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pdVar4 = vsolfree.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        (*pIVar3->_vptr_IkSolutionBase[2])
                  (pIVar3,solvalues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,pdVar4);
        uVar6 = 0;
        while( true ) {
          if ((ulong)((long)solvalues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)solvalues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) <= uVar6) break;
          printf("%.15f, ",
                 solvalues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6]);
          uVar6 = uVar6 + 1;
        }
        putchar(10);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&vsolfree.super__Vector_base<double,_std::allocator<double>_>);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&solvalues.super__Vector_base<double,_std::allocator<double>_>);
      iVar2 = 0;
    }
    else {
      fwrite("Failed to get ik solution\n",0x1a,1,_stderr);
      iVar2 = -1;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vfree.super__Vector_base<double,_std::allocator<double>_>);
    ikfast::IkSolutionList<double>::~IkSolutionList(&solutions);
  }
  else {
    printf("\nUsage: ./ik r00 r01 r02 t0 r10 r11 r12 t1 r20 r21 r22 t2 free0 ...\n\nReturns the ik solutions given the transformation of the end effector specified by\na 3x3 rotation R (rXX), and a 3x1 translation (tX).\nThere are %d free parameters that have to be specified.\n\n"
           ,0);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if( argc != 12+GetNumFreeParameters()+1 ) {
        printf("\nUsage: ./ik r00 r01 r02 t0 r10 r11 r12 t1 r20 r21 r22 t2 free0 ...\n\n"
               "Returns the ik solutions given the transformation of the end effector specified by\n"
               "a 3x3 rotation R (rXX), and a 3x1 translation (tX).\n"
               "There are %d free parameters that have to be specified.\n\n",GetNumFreeParameters());
        return 1;
    }

    IkSolutionList<IkReal> solutions;
    std::vector<IkReal> vfree(GetNumFreeParameters());
    IkReal eerot[9],eetrans[3];
    eerot[0] = atof(argv[1]); eerot[1] = atof(argv[2]); eerot[2] = atof(argv[3]); eetrans[0] = atof(argv[4]);
    eerot[3] = atof(argv[5]); eerot[4] = atof(argv[6]); eerot[5] = atof(argv[7]); eetrans[1] = atof(argv[8]);
    eerot[6] = atof(argv[9]); eerot[7] = atof(argv[10]); eerot[8] = atof(argv[11]); eetrans[2] = atof(argv[12]);
    for(std::size_t i = 0; i < vfree.size(); ++i)
        vfree[i] = atof(argv[13+i]);
    bool bSuccess = ComputeIk(eetrans, eerot, vfree.size() > 0 ? &vfree[0] : NULL, solutions);

    if( !bSuccess ) {
        fprintf(stderr,"Failed to get ik solution\n");
        return -1;
    }

    printf("Found %d ik solutions:\n", (int)solutions.GetNumSolutions());
    std::vector<IkReal> solvalues(GetNumJoints());
    for(std::size_t i = 0; i < solutions.GetNumSolutions(); ++i) {
        const IkSolutionBase<IkReal>& sol = solutions.GetSolution(i);
        printf("sol%d (free=%d): ", (int)i, (int)sol.GetFree().size());
        std::vector<IkReal> vsolfree(sol.GetFree().size());
        sol.GetSolution(&solvalues[0],vsolfree.size()>0?&vsolfree[0]:NULL);
        for( std::size_t j = 0; j < solvalues.size(); ++j)
            printf("%.15f, ", solvalues[j]);
        printf("\n");
    }
    return 0;
}